

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

any * __thiscall
Omega_h::InputYamlReader::map_item
          (any *__return_storage_ptr__,InputYamlReader *this,any *key_any,any *value_any)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_ptr<Omega_h::Input> *this_00;
  char *pcVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  type_info *ptVar6;
  _func_int **pp_Var7;
  InputList *this_01;
  InputScalar *this_02;
  InputMap *this_03;
  undefined8 *puVar8;
  ParserFail *this_04;
  InputMap value;
  NameValue result;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
  _Stack_88;
  NameValue local_58;
  
  paVar1 = &local_58.name.field_2;
  local_58.name._M_string_length = 0;
  local_58.name.field_2._M_local_buf[0] = '\0';
  local_58.value.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.value.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.name._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = any::is_typed(key_any,(type_info *)&std::__cxx11::string::typeinfo);
  if (!bVar4 || (string *)(key_any->storage).dynamic == (string *)0x0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = &PTR__bad_cast_004c4678;
    __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  std::__cxx11::string::operator=((string *)&local_58,(string *)(key_any->storage).dynamic);
  if (value_any->vtable == (vtable_type *)0x0) {
    ptVar6 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar6 = (*value_any->vtable->type)();
  }
  this_00 = &local_58.value;
  pcVar2 = *(char **)(ptVar6 + 8);
  if ((pcVar2 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
     ((*pcVar2 != '*' &&
      (iVar5 = strcmp(pcVar2,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar5 == 0))))
  {
    bVar4 = any::is_typed(value_any,(type_info *)&std::__cxx11::string::typeinfo);
    plVar3 = (long *)(value_any->storage).dynamic;
    if (!bVar4 || plVar3 == (long *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = &PTR__bad_cast_004c4678;
      __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    pp_Var7 = (_func_int **)(plVar3 + 2);
    if ((_func_int **)*plVar3 == pp_Var7) {
      local_90 = (undefined1  [8])*pp_Var7;
      _Stack_88._M_impl._0_8_ = plVar3[3];
      local_a0._0_8_ = local_90;
    }
    else {
      local_90 = (undefined1  [8])*pp_Var7;
      local_a0._0_8_ = (_func_int **)*plVar3;
    }
    local_a0._8_8_ = plVar3[1];
    *plVar3 = (long)pp_Var7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    this_02 = (InputScalar *)operator_new(0x38);
    InputScalar::InputScalar(this_02,(string *)local_a0);
    std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputScalar>
              (&this_00->super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>,this_02);
    if ((undefined1 *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,(ulong)((long)local_90 + 1));
    }
  }
  else {
    if (value_any->vtable == (vtable_type *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar6 = (*value_any->vtable->type)();
    }
    pcVar2 = *(char **)(ptVar6 + 8);
    if ((pcVar2 == "N7Omega_h9InputListE") ||
       ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,"N7Omega_h9InputListE"), iVar5 == 0)))) {
      bVar4 = any::is_typed(value_any,(type_info *)&InputList::typeinfo);
      if (!bVar4 || (InputList *)(value_any->storage).dynamic == (InputList *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = &PTR__bad_cast_004c4678;
        __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      InputList::InputList((InputList *)local_a0,(InputList *)(value_any->storage).dynamic);
      this_01 = (InputList *)operator_new(0x30);
      InputList::InputList(this_01,(InputList *)local_a0);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputList>
                (&this_00->super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>,this_01);
      local_a0._0_8_ = &PTR__InputList_004c5870;
      std::
      vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>::
      ~vector((vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
               *)(local_90 + 8));
    }
    else {
      if (value_any->vtable == (vtable_type *)0x0) {
        ptVar6 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar6 = (*value_any->vtable->type)();
      }
      pcVar2 = *(char **)(ptVar6 + 8);
      if ((pcVar2 != "N7Omega_h8InputMapE") &&
         ((*pcVar2 == '*' || (iVar5 = strcmp(pcVar2,"N7Omega_h8InputMapE"), iVar5 != 0)))) {
        local_a0._0_8_ = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"unexpected YAML map value type ","");
        if (value_any->vtable != (vtable_type *)0x0) {
          (*value_any->vtable->type)();
        }
        std::__cxx11::string::append(local_a0);
        std::__cxx11::string::append(local_a0);
        std::__cxx11::string::_M_append(local_a0,(ulong)local_58.name._M_dataplus._M_p);
        std::__cxx11::string::append(local_a0);
        this_04 = (ParserFail *)__cxa_allocate_exception(0x10);
        ParserFail::ParserFail(this_04,(string *)local_a0);
        __cxa_throw(this_04,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      bVar4 = any::is_typed(value_any,(type_info *)&InputMap::typeinfo);
      if (!bVar4 || (InputMap *)(value_any->storage).dynamic == (InputMap *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = &PTR__bad_cast_004c4678;
        __cxa_throw(puVar8,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      InputMap::InputMap((InputMap *)local_a0,(InputMap *)(value_any->storage).dynamic);
      this_03 = (InputMap *)operator_new(0x48);
      InputMap::InputMap(this_03,(InputMap *)local_a0);
      std::__shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::InputMap>
                (&this_00->super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>,this_03);
      local_a0._0_8_ = &PTR__InputMap_004c5848;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
                   *)(local_90 + 8));
    }
  }
  __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<Omega_h::NameValue>()::table;
  any::do_construct<Omega_h::NameValue,Omega_h::NameValue>(__return_storage_ptr__,&local_58);
  if (local_58.value.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.value.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.name._M_dataplus._M_p,
                    CONCAT71(local_58.name.field_2._M_allocated_capacity._1_7_,
                             local_58.name.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

any map_item(any& key_any, any& value_any) {
    NameValue result;
    result.name = any_cast<std::string&&>(std::move(key_any));
    if (value_any.type() == typeid(std::string)) {
      std::string value = any_cast<std::string&&>(std::move(value_any));
      result.value.reset(new InputScalar(value));
    } else if (value_any.type() == typeid(InputList)) {
      InputList value = any_cast<InputList&&>(std::move(value_any));
      result.value.reset(new InputList(std::move(value)));
    } else if (value_any.type() == typeid(InputMap)) {
      InputMap value = any_cast<InputMap&&>(std::move(value_any));
      result.value.reset(new InputMap(std::move(value)));
    } else {
      std::string msg = "unexpected YAML map value type ";
      msg += value_any.type().name();
      msg += " for name \"";
      msg += result.name;
      msg += "\"\n";
      throw ParserFail(msg);
    }
    return any(std::move(result));
  }